

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.hpp
# Opt level: O3

uint __thiscall diy::io::NumPy::read_header(NumPy *this)

{
  uint uVar1;
  size_t sVar2;
  runtime_error *this_00;
  bool fortran;
  Shape shape;
  bool local_29;
  Shape local_28;
  
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar2 = parse_npy_header(this,&local_28,&local_29);
  if (local_29 != true) {
    (this->super_BOV).offset_ = sVar2;
    BOV::set_shape<std::vector<int,std::allocator<int>>>(&this->super_BOV,&local_28);
    uVar1 = this->word_size_;
    if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return uVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"diy::io::NumPy cannot read data in fortran order");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unsigned          read_header()
      {
        BOV::Shape  shape;
        bool        fortran;
        size_t      offset = parse_npy_header(shape, fortran);
        if (fortran)
            throw std::runtime_error("diy::io::NumPy cannot read data in fortran order");
        BOV::set_offset(offset);
        BOV::set_shape(shape);
        return word_size_;
      }